

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::TextFlow::Column::Column(Column *this,string *text)

{
  AnsiSkippingString *in_RSI;
  string *in_RDI;
  
  AnsiSkippingString::AnsiSkippingString(in_RSI,in_RDI);
  in_RDI[1]._M_string_length = 0x4f;
  in_RDI[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[1].field_2 + 8) = 0xffffffffffffffff;
  return;
}

Assistant:

explicit Column( std::string const& text ): m_string( text ) {}